

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::convert_packing(Mat *src,Mat *dst,int _packing,Allocator *allocator,int num_threads)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  Option opt;
  ParamDict pd;
  ParamDict local_5d0;
  
  pLVar3 = create_layer(0x3e);
  ParamDict::ParamDict(&local_5d0);
  ParamDict::set(&local_5d0,0,_packing);
  (*pLVar3->_vptr_Layer[2])(pLVar3,&local_5d0);
  get_default_option();
  (*pLVar3->_vptr_Layer[7])(pLVar3,src,dst);
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  lVar4 = 0x560;
  do {
    piVar1 = *(int **)((long)&local_5d0.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_5d0.params[0].loaded + lVar4);
        plVar2 = *(long **)((long)&local_5d0.params[0].v.packing + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar4) = 0;
    *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return;
}

Assistant:

void convert_packing(const Mat& src, Mat& dst, int _packing, Allocator* allocator, int num_threads)
{
    ncnn::Layer* packing = ncnn::create_layer(ncnn::LayerType::Packing);

    ncnn::ParamDict pd;
    pd.set(0, _packing);

    packing->load_param(pd);

    ncnn::Option opt = ncnn::get_default_option();
    opt.num_threads = num_threads;
    opt.blob_allocator = allocator;

    packing->forward(src, dst, opt);

    delete packing;
}